

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O3

void __thiscall MeshLib::Solid::removeDanglingVertices(Solid *this)

{
  Tree<MeshLib::Vertex> *tree;
  int *piVar1;
  Vertex *pVVar2;
  pointer pcVar3;
  ListNode<MeshLib::Vertex> *pLVar4;
  ListNode<MeshLib::Vertex> *pLVar5;
  Node<MeshLib::Vertex> *pNVar6;
  ListNode<MeshLib::Vertex> *pLVar7;
  List<MeshLib::Vertex> dangling_verts;
  TreeIterator<MeshLib::Vertex> viter;
  undefined1 auStack_158 [16];
  int local_148;
  TreeIterator<MeshLib::Vertex> local_140;
  
  auStack_158._8_8_ = (ListNode<MeshLib::Vertex> *)0x0;
  local_148 = 0;
  tree = &this->m_verts;
  AVL::TreeIterator<MeshLib::Vertex>::TreeIterator(&local_140,tree);
  if (local_140.m_finished != true) {
    do {
      pVVar2 = (local_140.m_pointer)->data;
      if (pVVar2->m_halfedge == (HalfEdge *)0x0) {
        pLVar5 = (ListNode<MeshLib::Vertex> *)operator_new(0x10);
        pLVar5->m_data = pVVar2;
        pLVar7 = (ListNode<MeshLib::Vertex> *)auStack_158;
        for (pLVar4 = (ListNode<MeshLib::Vertex> *)auStack_158._8_8_;
            pLVar4 != (ListNode<MeshLib::Vertex> *)0x0; pLVar4 = pLVar4->m_next) {
          pLVar7 = pLVar4;
        }
        pLVar7->m_next = pLVar5;
        pLVar5->m_next = (ListNode<MeshLib::Vertex> *)0x0;
        local_148 = local_148 + 1;
      }
      AVL::TreeIterator<MeshLib::Vertex>::operator++(&local_140);
      pLVar7 = (ListNode<MeshLib::Vertex> *)auStack_158._8_8_;
    } while (local_140.m_finished == false);
    for (; pLVar7 != (ListNode<MeshLib::Vertex> *)0x0; pLVar7 = pLVar7->m_next) {
      pVVar2 = pLVar7->m_data;
      pNVar6 = AVL::Node<MeshLib::Vertex>::remove_node(tree->root,pVVar2);
      tree->root = pNVar6;
      if (pNVar6 != (Node<MeshLib::Vertex> *)0x0) {
        piVar1 = &(this->m_verts).size;
        *piVar1 = *piVar1 + -1;
      }
      if ((pVVar2 != (Vertex *)0x0) &&
         (pcVar3 = (pVVar2->m_string)._M_dataplus._M_p,
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)pcVar3 != &(pVVar2->m_string).field_2)) {
        operator_delete(pcVar3);
      }
      operator_delete(pVVar2);
    }
  }
  List<MeshLib::Vertex>::~List((List<MeshLib::Vertex> *)((long)auStack_158 + 8));
  return;
}

Assistant:

void 
Solid::removeDanglingVertices()
{
	List<Vertex> dangling_verts;
	//Label boundary edges
	for( AVL::TreeIterator<Vertex> viter( m_verts ); ! viter.end() ; ++ viter )
	{
		Solid::tVertex     v = *viter;
		if( v->halfedge() != NULL ) continue;
		dangling_verts.Append( v );
	}

	for( ListIterator<Vertex> iter( dangling_verts ); !iter.end(); ++ iter )
	{
		Solid::tVertex v = *iter;
		m_verts.remove( v );
		delete v;
		v = NULL;
	}
}